

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O0

int hugeRead(void *context,char *buffer,int len)

{
  int iVar1;
  size_t sVar2;
  int local_24;
  int len_local;
  char *buffer_local;
  void *context_local;
  
  iVar1 = rlen;
  if (((context == (void *)0x0) || (buffer == (char *)0x0)) || (len < 0)) {
    context_local._4_4_ = -1;
  }
  else {
    if (len < rlen) {
      memcpy(buffer,current,(long)len);
      rlen = rlen - len;
      current = current + len;
      local_24 = len;
    }
    else {
      if (1000 < curseg) {
        rlen = 0;
        return 0;
      }
      local_24 = rlen;
      rlen = 0;
      memcpy(buffer,current,(long)iVar1);
      curseg = curseg + 1;
      if (curseg == 1000) {
        current = hugeDocParts->finish;
      }
      else {
        current = hugeDocParts->segment;
      }
      sVar2 = strlen(current);
      rlen = (int)sVar2;
    }
    context_local._4_4_ = local_24;
  }
  return context_local._4_4_;
}

Assistant:

static int
hugeRead(void *context, char *buffer, int len)
{
    if ((context == NULL) || (buffer == NULL) || (len < 0))
        return (-1);

    if (len >= rlen) {
        if (curseg >= MAX_NODES + 1) {
            rlen = 0;
            return(0);
        }
        len = rlen;
        rlen = 0;
	memcpy(buffer, current, len);
        curseg ++;
        if (curseg == MAX_NODES) {
            current = hugeDocParts->finish;
	} else {
            current = hugeDocParts->segment;
	}
        rlen = strlen(current);
    } else {
	memcpy(buffer, current, len);
	rlen -= len;
        current += len;
    }
    return (len);
}